

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_get_populated_multiple_string_key(planck_unit_test_t *tc)

{
  int iVar1;
  uint uVar2;
  int local_ac;
  ion_dictionary_t dict;
  char key [9];
  ion_dictionary_handler_t handler;
  
  key[8] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  bhdct_setup_string_key(tc,&handler,&dict,ion_fill_low);
  iVar1 = 0;
  for (uVar2 = 0; uVar2 != 10; uVar2 = uVar2 + 1) {
    sprintf(key,"k%d",(ulong)uVar2);
    local_ac = iVar1;
    bhdct_get(tc,&dict,key,&local_ac,'\0',1);
    iVar1 = iVar1 + 2;
  }
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_get_populated_multiple_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_low);

	int i;

	ION_FILL_LOW_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, ION_LOW_VALUE(i), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}